

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void __kmp_api_omp_set_max_active_levels(int arg)

{
  int in_stack_00000090;
  int in_stack_00000094;
  
  __kmp_get_global_thread_id_reg();
  __kmp_set_max_active_levels(in_stack_00000094,in_stack_00000090);
  return;
}

Assistant:

void FTN_STDCALL
xexpand(FTN_SET_MAX_ACTIVE_LEVELS)( int KMP_DEREF arg )
{
    #ifdef KMP_STUB
	// Nothing.
    #else
	/*  TO DO  */
        /* We want per-task implementation of this internal control */
        __kmp_set_max_active_levels( __kmp_entry_gtid(), KMP_DEREF arg );
    #endif
}